

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.c
# Opt level: O0

void sound_byte(ubyte iobyte)

{
  ubyte iobyte_local;
  
  if ((iobyte & 0xe0) != 0xe0) {
    if ((iobyte & 0x90) == 0x90) {
      get_vol(iobyte);
    }
    if ((iobyte & 0x90) == 0x80) {
      get_freq(iobyte);
    }
    if ((iobyte & 0x80) == 0) {
      get_freq(iobyte);
    }
    if (soundyesno != '\0') {
      update_sound();
    }
  }
  return;
}

Assistant:

void sound_byte(ubyte iobyte) {      // if a noise program byte, return
    if ((iobyte & 0xE0) == 0xE0) return;

    if ((iobyte & 0x90) == 0x90) get_vol(iobyte);  // if a volume byte
    if ((iobyte & 0x90) == 0x80) get_freq(iobyte); // if a frequency byte
    if (!(iobyte & 0x80)) get_freq(iobyte);      // if a frequency byte
    if (soundyesno) update_sound();            // update sound

}